

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O3

void qDrawEdge(QPainter *p,qreal x1,qreal y1,qreal x2,qreal y2,qreal dw1,qreal dw2,Edge edge,
              BorderStyle style,QBrush c)

{
  int iVar1;
  int iVar2;
  BorderStyle BVar3;
  int iVar4;
  BorderStyle style_00;
  Edge edge_00;
  BorderStyle style_01;
  __uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter> c_00;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  double dVar7;
  QColor color;
  QColor QVar8;
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  QRectF local_78;
  double local_58;
  double dStack_50;
  double local_48;
  qreal qStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(p);
  if ((edge & ~BottomEdge) == TopEdge) {
    dVar7 = y2 - y1;
  }
  else {
    dVar7 = x2 - x1;
  }
  BVar3 = BorderStyle_Solid;
  if (2.0 < dVar7) {
    BVar3 = style;
  }
  if (style != BorderStyle_Double) {
    BVar3 = style;
  }
  style_01 = BorderStyle_Inset;
  style_00 = BorderStyle_Outset;
  switch(BVar3) {
  case BorderStyle_Dotted:
  case BorderStyle_Dashed:
  case BorderStyle_DotDash:
  case BorderStyle_DotDotDash:
    qPenFromStyle((QBrush *)&local_78,dVar7,
                  (BorderStyle)
                  c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    QPainter::setPen(p,(QPen *)&local_78);
    QPen::~QPen((QPen *)&local_78);
    if ((dVar7 != 1.0) || (NAN(dVar7))) {
      if ((edge & ~BottomEdge) == TopEdge) {
        local_78.xp = x1 + dVar7 * 0.5;
        local_78.yp = (y1 + y2) * 0.5;
        local_78.w = x2 - dVar7 * 0.5;
        local_78.h = local_78.yp;
      }
      else {
        local_78.xp = (x1 + x2) * 0.5;
        local_78.yp = y1 + dVar7 * 0.5;
        local_78.h = y2 - dVar7 * 0.5;
        local_78.w = local_78.xp;
      }
    }
    else {
      local_78.w = x2 + -1.0;
      local_78.h = y2 + -1.0;
      local_78.xp = x1;
      local_78.yp = y1;
    }
    QPainter::drawLines(p,(QLineF *)&local_78,1);
    goto switchD_005d4f3b_default;
  case BorderStyle_Solid:
    break;
  case BorderStyle_Double:
    if (LeftEdge < edge) goto switchD_005d4f3b_default;
    iVar4 = (int)((double)((ulong)(dVar7 / 3.0) & 0x8000000000000000 | 0x3fe0000000000000) +
                 dVar7 / 3.0);
    iVar2 = (int)((double)((ulong)(dw1 / 3.0) & 0x8000000000000000 | 0x3fe0000000000000) + dw1 / 3.0
                 );
    iVar1 = (int)((double)((ulong)(dw2 / 3.0) & 0x8000000000000000 | 0x3fe0000000000000) + dw2 / 3.0
                 );
    switch(edge) {
    case TopEdge:
      dVar5 = (double)iVar2;
      QBrush::QBrush((QBrush *)local_80,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x1,y1,x2,(double)iVar4 + y1,dVar5,(double)iVar1,TopEdge,BorderStyle_Solid,
                (QBrush)local_80);
      QBrush::~QBrush((QBrush *)local_80);
      x1 = (dw1 + x1) - dVar5;
      dVar7 = y2 - (double)iVar4;
      x2 = (x2 - dw2) + dVar5;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_88;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = TopEdge;
      break;
    case RightEdge:
      QBrush::QBrush((QBrush *)local_b0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x2 - (double)iVar4,y1,x2,y2,(double)iVar2,(double)iVar1,RightEdge,
                BorderStyle_Solid,(QBrush)local_b0);
      QBrush::~QBrush((QBrush *)local_b0);
      dVar7 = (dw1 + y1) - (double)iVar2;
      x2 = (double)iVar4 + x1;
      y2 = (y2 - dw2) + (double)iVar1;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_b8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = RightEdge;
      break;
    case BottomEdge:
      QBrush::QBrush((QBrush *)local_a0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,(dw1 + x1) - (double)iVar2,y1,(x2 - dw2) + (double)iVar1,(double)iVar4 + y1,
                (double)iVar2,(double)iVar1,BottomEdge,BorderStyle_Solid,(QBrush)local_a0);
      QBrush::~QBrush((QBrush *)local_a0);
      dVar7 = y2 - (double)iVar4;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_a8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = BottomEdge;
      break;
    case LeftEdge:
      QBrush::QBrush((QBrush *)local_90,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x1,y1,(double)iVar4 + x1,y2,(double)iVar2,(double)iVar1,LeftEdge,BorderStyle_Solid
                ,(QBrush)local_90);
      QBrush::~QBrush((QBrush *)local_90);
      x1 = x2 - (double)iVar4;
      dVar7 = (dw1 + y1) - (double)iVar2;
      y2 = (y2 - dw2) + (double)iVar1;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_98;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = LeftEdge;
    }
    style_00 = BorderStyle_Solid;
    dVar5 = x2;
    goto LAB_005d5a73;
  case BorderStyle_Groove:
    goto switchD_005d4f3b_caseD_8;
  case BorderStyle_Ridge:
    style_01 = BorderStyle_Outset;
    style_00 = BorderStyle_Inset;
    goto switchD_005d4f3b_caseD_8;
  case BorderStyle_Inset:
    if (edge - RightEdge < 2) {
LAB_005d5322:
      QVar8 = QColor::lighter((QColor *)
                              (*(long *)c.d._M_t.
                                        super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>
                                        .super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8
                              ),0x96);
      color._8_8_ = QVar8._8_8_ & 0xffffffffffff;
      color._0_8_ = QVar8._0_8_;
      QBrush::operator=((QBrush *)
                        c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,color);
    }
    break;
  case BorderStyle_Outset:
    if ((edge == TopEdge) || (edge == LeftEdge)) goto LAB_005d5322;
    break;
  default:
    goto switchD_005d4f3b_default;
  }
  QPainter::setPen(p,NoPen);
  QPainter::setBrush(p,(QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
  if (((dVar7 == 1.0) && (!NAN(dVar7))) ||
     ((dw1 == 0.0 && (((!NAN(dw1) && (dw2 == 0.0)) && (!NAN(dw2))))))) {
    local_78.w = x2 - x1;
    local_78.h = y2 - y1;
    local_78.xp = x1;
    local_78.yp = y1;
    QPainter::drawRects(p,&local_78,1);
  }
  else {
    local_48 = 0.0;
    qStack_40 = 0.0;
    local_58 = 0.0;
    dStack_50 = 0.0;
    local_78.w = 0.0;
    local_78.h = 0.0;
    local_78.xp = 0.0;
    local_78.yp = 0.0;
    switch(edge) {
    case TopEdge:
      local_78.w = dw1 + x1;
      local_58 = x2 - dw2;
      local_78.xp = x1;
      local_78.yp = y1;
      local_78.h = y2;
      dStack_50 = y2;
      local_48 = x2;
      qStack_40 = y1;
      break;
    case RightEdge:
      local_78.yp = dw1 + y1;
      local_78.h = y2 - dw2;
      local_78.xp = x1;
      local_78.w = x1;
      local_58 = x2;
      dStack_50 = y2;
      local_48 = x2;
      qStack_40 = y1;
      break;
    case BottomEdge:
      local_78.xp = dw1 + x1;
      local_48 = x2 - dw2;
      local_78.yp = y1;
      local_78.w = x1;
      local_78.h = y2;
      local_58 = x2;
      dStack_50 = y2;
      qStack_40 = y1;
      break;
    case LeftEdge:
      dStack_50 = y2 - dw2;
      qStack_40 = dw1 + y1;
      local_78.xp = x1;
      local_78.yp = y1;
      local_78.w = x1;
      local_78.h = y2;
      local_58 = x2;
      local_48 = x2;
    }
    QPainter::drawConvexPolygon(p,(QPointF *)&local_78,4);
  }
switchD_005d4f3b_default:
  QPainter::restore(p);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
switchD_005d4f3b_caseD_8:
  dVar5 = floor(dw1 * 0.5);
  dVar6 = floor(dw2 * 0.5);
  if (edge < NumEdges) {
    iVar2 = (int)dVar5;
    iVar1 = (int)dVar6;
    iVar4 = (int)((double)((ulong)(dVar7 * 0.5) & 0x8000000000000000 | (ulong)DAT_00674780) +
                 dVar7 * 0.5);
    switch(edge) {
    case TopEdge:
      dVar7 = (double)iVar4 + y1;
      QBrush::QBrush((QBrush *)local_c0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x1,y1,x2,dVar7,(double)iVar2,(double)iVar1,TopEdge,style_01,(QBrush)local_c0);
      QBrush::~QBrush((QBrush *)local_c0);
      x1 = x1 + (double)iVar2;
      dVar5 = x2 - (double)iVar1;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_c8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = TopEdge;
      break;
    case RightEdge:
      dVar5 = (double)iVar4 + x1;
      QBrush::QBrush((QBrush *)local_f0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,dVar5,y1,x2,y2,(double)iVar2,(double)iVar1,RightEdge,style_01,(QBrush)local_f0);
      QBrush::~QBrush((QBrush *)local_f0);
      dVar7 = y1 + (double)iVar2;
      y2 = y2 - (double)iVar1;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_f8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = RightEdge;
      break;
    case BottomEdge:
      QBrush::QBrush((QBrush *)local_d0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x1,(double)iVar4 + y1,x2,y2,(double)iVar2,(double)iVar1,BottomEdge,style_01,
                (QBrush)local_d0);
      QBrush::~QBrush((QBrush *)local_d0);
      x1 = x1 + (double)iVar2;
      dVar5 = x2 - (double)iVar1;
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_d8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = BottomEdge;
      dVar7 = y1;
      y2 = (double)iVar4 + y1;
      break;
    case LeftEdge:
      QBrush::QBrush((QBrush *)local_e0,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      qDrawEdge(p,x1,y1,(double)iVar4 + x1,y2,(double)iVar2,(double)iVar1,LeftEdge,style_01,
                (QBrush)local_e0);
      QBrush::~QBrush((QBrush *)local_e0);
      c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           (tuple<QBrushData_*,_QBrushDataPointerDeleter>)local_e8;
      QBrush::QBrush((QBrush *)
                     c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                     (QBrush *)
                     c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      edge_00 = LeftEdge;
      x1 = (double)iVar4 + x1;
      dVar7 = y1 + (double)iVar2;
      dVar5 = x2;
      y2 = y2 - (double)iVar1;
    }
LAB_005d5a73:
    qDrawEdge(p,x1,dVar7,dVar5,y2,(double)iVar2,(double)iVar1,edge_00,style_00,
              (QBrush)c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    QBrush::~QBrush((QBrush *)
                    c_00._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
  }
  goto switchD_005d4f3b_default;
}

Assistant:

void qDrawEdge(QPainter *p, qreal x1, qreal y1, qreal x2, qreal y2, qreal dw1, qreal dw2,
               QCss::Edge edge, QCss::BorderStyle style, QBrush c)
{
    p->save();
    const qreal width = (edge == TopEdge || edge == BottomEdge) ? (y2-y1) : (x2-x1);

    if (width <= 2 && style == BorderStyle_Double)
        style = BorderStyle_Solid;

    switch (style) {
    case BorderStyle_Inset:
    case BorderStyle_Outset:
        if ((style == BorderStyle_Outset && (edge == TopEdge || edge == LeftEdge))
            || (style == BorderStyle_Inset && (edge == BottomEdge || edge == RightEdge)))
            c = c.color().lighter();
        Q_FALLTHROUGH();
    case BorderStyle_Solid: {
        p->setPen(Qt::NoPen);
        p->setBrush(c);
        if (width == 1 || (dw1 == 0 && dw2 == 0)) {
            p->drawRect(QRectF(x1, y1, x2-x1, y2-y1));
        } else { // draw trapezoid
            std::array<QPointF, 4> quad;
            switch (edge) {
            case TopEdge:
                quad = {QPointF(x1, y1), QPointF(x1 + dw1, y2),
                        QPointF(x2 - dw2, y2), QPointF(x2, y1)};
                break;
            case BottomEdge:
                quad = {QPointF(x1 + dw1, y1), QPointF(x1, y2),
                        QPointF(x2, y2), QPointF(x2 - dw2, y1)};
                break;
            case LeftEdge:
                quad = {QPointF(x1, y1), QPointF(x1, y2),
                        QPointF(x2, y2 - dw2), QPointF(x2, y1 + dw1)};
                break;
            case RightEdge:
                quad = {QPointF(x1, y1 + dw1), QPointF(x1, y2 - dw2),
                        QPointF(x2, y2), QPointF(x2, y1)};
                break;
            default:
                break;
            }
            p->drawConvexPolygon(quad.data(), static_cast<int>(quad.size()));
        }
        break;
    }
    case BorderStyle_Dotted:
    case BorderStyle_Dashed:
    case BorderStyle_DotDash:
    case BorderStyle_DotDotDash:
        p->setPen(qPenFromStyle(c, width, style));
        if (width == 1)
            p->drawLine(QLineF(x1, y1, x2 - 1, y2 - 1));
        else if (edge == TopEdge || edge == BottomEdge)
            p->drawLine(QLineF(x1 + width/2, (y1 + y2)/2, x2 - width/2, (y1 + y2)/2));
        else
            p->drawLine(QLineF((x1+x2)/2, y1 + width/2, (x1+x2)/2, y2 - width/2));
        break;

    case BorderStyle_Double: {
        int wby3 = qRound(width/3);
        int dw1by3 = qRound(dw1/3);
        int dw2by3 = qRound(dw2/3);
        switch (edge) {
        case TopEdge:
            qDrawEdge(p, x1, y1, x2, y1 + wby3, dw1by3, dw2by3, TopEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1 + dw1 - dw1by3, y2 - wby3, x2 - dw2 + dw1by3, y2,
                      dw1by3, dw2by3, TopEdge, BorderStyle_Solid, c);
            break;
        case LeftEdge:
            qDrawEdge(p, x1, y1, x1 + wby3, y2, dw1by3, dw2by3, LeftEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x2 - wby3, y1 + dw1 - dw1by3, x2, y2 - dw2 + dw2by3, dw1by3, dw2by3,
                      LeftEdge, BorderStyle_Solid, c);
            break;
        case BottomEdge:
            qDrawEdge(p, x1 + dw1 - dw1by3, y1, x2 - dw2 + dw2by3, y1 + wby3, dw1by3, dw2by3,
                      BottomEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1, y2 - wby3, x2, y2, dw1by3, dw2by3, BottomEdge, BorderStyle_Solid, c);
            break;
        case RightEdge:
            qDrawEdge(p, x2 - wby3, y1, x2, y2, dw1by3, dw2by3, RightEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1, y1 + dw1 - dw1by3, x1 + wby3, y2 - dw2 + dw2by3, dw1by3, dw2by3,
                      RightEdge, BorderStyle_Solid, c);
            break;
        default:
            break;
        }
        break;
    }
    case BorderStyle_Ridge:
    case BorderStyle_Groove: {
        BorderStyle s1, s2;
        if (style == BorderStyle_Groove) {
            s1 = BorderStyle_Inset;
            s2 = BorderStyle_Outset;
        } else {
            s1 = BorderStyle_Outset;
            s2 = BorderStyle_Inset;
        }
        int dw1by2 = qFloor(dw1/2), dw2by2 = qFloor(dw2/2);
        int wby2 = qRound(width/2);
        switch (edge) {
        case TopEdge:
            qDrawEdge(p, x1, y1, x2, y1 + wby2, dw1by2, dw2by2, TopEdge, s1, c);
            qDrawEdge(p, x1 + dw1by2, y1 + wby2, x2 - dw2by2, y2, dw1by2, dw2by2, TopEdge, s2, c);
            break;
        case BottomEdge:
            qDrawEdge(p, x1, y1 + wby2, x2, y2, dw1by2, dw2by2, BottomEdge, s1, c);
            qDrawEdge(p, x1 + dw1by2, y1, x2 - dw2by2, y1 + wby2, dw1by2, dw2by2, BottomEdge, s2, c);
            break;
        case LeftEdge:
            qDrawEdge(p, x1, y1, x1 + wby2, y2, dw1by2, dw2by2, LeftEdge, s1, c);
            qDrawEdge(p, x1 + wby2, y1 + dw1by2, x2, y2 - dw2by2, dw1by2, dw2by2, LeftEdge, s2, c);
            break;
        case RightEdge:
            qDrawEdge(p, x1 + wby2, y1, x2, y2, dw1by2, dw2by2, RightEdge, s1, c);
            qDrawEdge(p, x1, y1 + dw1by2, x1 + wby2, y2 - dw2by2, dw1by2, dw2by2, RightEdge, s2, c);
            break;
        default:
            break;
        }
        break;
    }
    default:
        break;
    }
    p->restore();
}